

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void cppcms::impl::md5_finish(md5_state_t *pms,md5_byte_t *digest)

{
  byte bVar1;
  long lVar2;
  md5_byte_t data [8];
  
  bVar1 = 0;
  for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
    data[lVar2] = (md5_byte_t)
                  (*(uint *)((long)pms->count + (ulong)((uint)lVar2 & 0xfffffffc)) >> (bVar1 & 0x18)
                  );
    bVar1 = bVar1 + 8;
  }
  md5_append(pms,md5_finish::pad,(0x37 - (pms->count[0] >> 3) & 0x3f) + 1);
  md5_append(pms,data,8);
  bVar1 = 0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 1) {
    digest[lVar2] =
         (md5_byte_t)
         (*(uint *)((long)pms->abcd + (ulong)((uint)lVar2 & 0xfffffffc)) >> (bVar1 & 0x18));
    bVar1 = bVar1 + 8;
  }
  return;
}

Assistant:

void
md5_finish(md5_state_t *pms, md5_byte_t digest[16])
{
    static const md5_byte_t pad[64] = {
	0x80, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
	0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
	0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0,
	0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0
    };
    md5_byte_t data[8];
    int i;

    /* Save the length before padding. */
    for (i = 0; i < 8; ++i)
	data[i] = (md5_byte_t)(pms->count[i >> 2] >> ((i & 3) << 3));
    /* Pad to 56 bytes mod 64. */
    md5_append(pms, pad, ((55 - (pms->count[0] >> 3)) & 63) + 1);
    /* Append the length. */
    md5_append(pms, data, 8);
    for (i = 0; i < 16; ++i)
	digest[i] = (md5_byte_t)(pms->abcd[i >> 2] >> ((i & 3) << 3));
}